

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charstr.cpp
# Opt level: O3

CharString * __thiscall
icu_63::CharString::ensureEndsWithFileSeparator(CharString *this,UErrorCode *errorCode)

{
  if (((*errorCode < U_ILLEGAL_ARGUMENT_ERROR) && (0 < (long)this->len)) &&
     ((this->buffer).ptr[(long)this->len + -1] != '/')) {
    append(this,'/',errorCode);
  }
  return this;
}

Assistant:

CharString &CharString::ensureEndsWithFileSeparator(UErrorCode &errorCode) {
    char c;
    if(U_SUCCESS(errorCode) && len>0 &&
            (c=buffer[len-1])!=U_FILE_SEP_CHAR && c!=U_FILE_ALT_SEP_CHAR) {
        append(U_FILE_SEP_CHAR, errorCode);
    }
    return *this;
}